

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlNodePtr xmlXPtrBuildRangeNodeList(xmlXPathObjectPtr range)

{
  xmlNodePtr node;
  xmlGenericErrorFunc p_Var1;
  xmlNodePtr pxVar2;
  xmlNodePtr cur_00;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlChar *local_70;
  xmlChar *content_1;
  xmlChar *pxStack_60;
  int len;
  xmlChar *content;
  int index2;
  int index1;
  xmlNodePtr end;
  xmlNodePtr cur;
  xmlNodePtr start;
  xmlNodePtr tmp;
  xmlNodePtr parent;
  xmlNodePtr last;
  xmlNodePtr list;
  xmlXPathObjectPtr range_local;
  
  last = (xmlNodePtr)0x0;
  parent = (xmlNodePtr)0x0;
  tmp = (xmlNodePtr)0x0;
  if (range == (xmlXPathObjectPtr)0x0) {
    range_local = (xmlXPathObjectPtr)0x0;
  }
  else if (range->type == XPATH_RANGE) {
    node = (xmlNodePtr)range->user;
    if ((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) {
      range_local = (xmlXPathObjectPtr)0x0;
    }
    else {
      _index2 = (xmlNodePtr)range->user2;
      if (_index2 == (xmlNodePtr)0x0) {
        range_local = (xmlXPathObjectPtr)xmlCopyNode(node,1);
      }
      else if (_index2->type == XML_NAMESPACE_DECL) {
        range_local = (xmlXPathObjectPtr)0x0;
      }
      else {
        content._4_4_ = range->index;
        content._0_4_ = range->index2;
        end = node;
        while (end != (xmlNodePtr)0x0) {
          if (end == _index2) {
            if (end->type == XML_TEXT_NODE) {
              pxStack_60 = end->content;
              if (pxStack_60 == (xmlChar *)0x0) {
                start = xmlNewTextLen((xmlChar *)0x0,0);
              }
              else {
                if ((end == node) && (1 < content._4_4_)) {
                  pxStack_60 = pxStack_60 + (content._4_4_ + -1);
                  content_1._4_4_ = (int)content - (content._4_4_ + -1);
                }
                else {
                  content_1._4_4_ = (int)content;
                }
                start = xmlNewTextLen(pxStack_60,content_1._4_4_);
              }
              if (last == (xmlNodePtr)0x0) {
                return start;
              }
              if (parent == (xmlNodePtr)0x0) {
                xmlAddChild(tmp,start);
              }
              else {
                xmlAddNextSibling(parent,start);
              }
              return last;
            }
            cur_00 = xmlCopyNode(end,0);
            pxVar2 = cur_00;
            if (last != (xmlNodePtr)0x0) {
              pxVar2 = last;
              if (parent == (xmlNodePtr)0x0) {
                xmlAddChild(tmp,cur_00);
              }
              else {
                xmlAddNextSibling(parent,cur_00);
              }
            }
            last = pxVar2;
            parent = (xmlNodePtr)0x0;
            if (1 < (int)content) {
              _index2 = xmlXPtrGetNthChild(end,(int)content + -1);
              content._0_4_ = 0;
            }
            tmp = cur_00;
            if ((end == node) && (1 < content._4_4_)) {
              end = xmlXPtrGetNthChild(end,content._4_4_ + -1);
              content._4_4_ = 0;
            }
            else {
              end = end->children;
            }
          }
          else if ((end == node) && (last == (xmlNodePtr)0x0)) {
            if ((end->type == XML_TEXT_NODE) || (end->type == XML_CDATA_SECTION_NODE)) {
              local_70 = end->content;
              if (local_70 == (xmlChar *)0x0) {
                parent = xmlNewTextLen((xmlChar *)0x0,0);
                last = parent;
              }
              else {
                if (1 < content._4_4_) {
                  local_70 = local_70 + (content._4_4_ + -1);
                }
                parent = xmlNewText(local_70);
                last = parent;
              }
              goto LAB_0027380b;
            }
            if ((end != node) || (content._4_4_ < 2)) {
              parent = xmlCopyNode(end,1);
              tmp = (xmlNodePtr)0x0;
              last = parent;
              goto LAB_0027380b;
            }
            last = xmlCopyNode(end,0);
            parent = (xmlNodePtr)0x0;
            end = xmlXPtrGetNthChild(end,content._4_4_ + -1);
            content._4_4_ = 0;
            tmp = last;
          }
          else {
            start = (xmlNodePtr)0x0;
            switch(end->type) {
            case XML_ATTRIBUTE_NODE:
              pp_Var3 = __xmlGenericError();
              p_Var1 = *pp_Var3;
              ppvVar4 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar4,"Internal error at %s:%d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                        ,0x60e);
              break;
            default:
              start = xmlCopyNode(end,1);
              break;
            case XML_ENTITY_NODE:
            case XML_DTD_NODE:
            case XML_ELEMENT_DECL:
            case XML_ATTRIBUTE_DECL:
              break;
            case XML_ENTITY_DECL:
              pp_Var3 = __xmlGenericError();
              p_Var1 = *pp_Var3;
              ppvVar4 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                        ,0x606);
              break;
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
            }
            if (start != (xmlNodePtr)0x0) {
              if ((last == (xmlNodePtr)0x0) ||
                 ((parent == (xmlNodePtr)0x0 && (tmp == (xmlNodePtr)0x0)))) {
                pp_Var3 = __xmlGenericError();
                p_Var1 = *pp_Var3;
                ppvVar4 = __xmlGenericErrorContext();
                (*p_Var1)(*ppvVar4,"Internal error at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                          ,0x616);
                return (xmlNodePtr)0x0;
              }
              if (parent == (xmlNodePtr)0x0) {
                xmlAddChild(tmp,start);
                parent = start;
              }
              else {
                xmlAddNextSibling(parent,start);
              }
            }
LAB_0027380b:
            if ((last == (xmlNodePtr)0x0) ||
               ((parent == (xmlNodePtr)0x0 && (tmp == (xmlNodePtr)0x0)))) {
              pp_Var3 = __xmlGenericError();
              p_Var1 = *pp_Var3;
              ppvVar4 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar4,"Internal error at %s:%d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                        ,0x625);
              return (xmlNodePtr)0x0;
            }
            end = xmlXPtrAdvanceNode(end,(int *)0x0);
          }
        }
        range_local = (xmlXPathObjectPtr)last;
      }
    }
  }
  else {
    range_local = (xmlXPathObjectPtr)0x0;
  }
  return (xmlNodePtr)range_local;
}

Assistant:

static xmlNodePtr
xmlXPtrBuildRangeNodeList(xmlXPathObjectPtr range) {
    /* pointers to generated nodes */
    xmlNodePtr list = NULL, last = NULL, parent = NULL, tmp;
    /* pointers to traversal nodes */
    xmlNodePtr start, cur, end;
    int index1, index2;

    if (range == NULL)
	return(NULL);
    if (range->type != XPATH_RANGE)
	return(NULL);
    start = (xmlNodePtr) range->user;

    if ((start == NULL) || (start->type == XML_NAMESPACE_DECL))
	return(NULL);
    end = range->user2;
    if (end == NULL)
	return(xmlCopyNode(start, 1));
    if (end->type == XML_NAMESPACE_DECL)
        return(NULL);

    cur = start;
    index1 = range->index;
    index2 = range->index2;
    while (cur != NULL) {
	if (cur == end) {
	    if (cur->type == XML_TEXT_NODE) {
		const xmlChar *content = cur->content;
		int len;

		if (content == NULL) {
		    tmp = xmlNewTextLen(NULL, 0);
		} else {
		    len = index2;
		    if ((cur == start) && (index1 > 1)) {
			content += (index1 - 1);
			len -= (index1 - 1);
			index1 = 0;
		    } else {
			len = index2;
		    }
		    tmp = xmlNewTextLen(content, len);
		}
		/* single sub text node selection */
		if (list == NULL)
		    return(tmp);
		/* prune and return full set */
		if (last != NULL)
		    xmlAddNextSibling(last, tmp);
		else
		    xmlAddChild(parent, tmp);
		return(list);
	    } else {
		tmp = xmlCopyNode(cur, 0);
		if (list == NULL)
		    list = tmp;
		else {
		    if (last != NULL)
			xmlAddNextSibling(last, tmp);
		    else
			xmlAddChild(parent, tmp);
		}
		last = NULL;
		parent = tmp;

		if (index2 > 1) {
		    end = xmlXPtrGetNthChild(cur, index2 - 1);
		    index2 = 0;
		}
		if ((cur == start) && (index1 > 1)) {
		    cur = xmlXPtrGetNthChild(cur, index1 - 1);
		    index1 = 0;
		} else {
		    cur = cur->children;
		}
		/*
		 * Now gather the remaining nodes from cur to end
		 */
		continue; /* while */
	    }
	} else if ((cur == start) &&
		   (list == NULL) /* looks superfluous but ... */ ) {
	    if ((cur->type == XML_TEXT_NODE) ||
		(cur->type == XML_CDATA_SECTION_NODE)) {
		const xmlChar *content = cur->content;

		if (content == NULL) {
		    tmp = xmlNewTextLen(NULL, 0);
		} else {
		    if (index1 > 1) {
			content += (index1 - 1);
		    }
		    tmp = xmlNewText(content);
		}
		last = list = tmp;
	    } else {
		if ((cur == start) && (index1 > 1)) {
		    tmp = xmlCopyNode(cur, 0);
		    list = tmp;
		    parent = tmp;
		    last = NULL;
		    cur = xmlXPtrGetNthChild(cur, index1 - 1);
		    index1 = 0;
		    /*
		     * Now gather the remaining nodes from cur to end
		     */
		    continue; /* while */
		}
		tmp = xmlCopyNode(cur, 1);
		list = tmp;
		parent = NULL;
		last = tmp;
	    }
	} else {
	    tmp = NULL;
	    switch (cur->type) {
		case XML_DTD_NODE:
		case XML_ELEMENT_DECL:
		case XML_ATTRIBUTE_DECL:
		case XML_ENTITY_NODE:
		    /* Do not copy DTD information */
		    break;
		case XML_ENTITY_DECL:
		    TODO /* handle crossing entities -> stack needed */
		    break;
		case XML_XINCLUDE_START:
		case XML_XINCLUDE_END:
		    /* don't consider it part of the tree content */
		    break;
		case XML_ATTRIBUTE_NODE:
		    /* Humm, should not happen ! */
		    STRANGE
		    break;
		default:
		    tmp = xmlCopyNode(cur, 1);
		    break;
	    }
	    if (tmp != NULL) {
		if ((list == NULL) || ((last == NULL) && (parent == NULL)))  {
		    STRANGE
		    return(NULL);
		}
		if (last != NULL)
		    xmlAddNextSibling(last, tmp);
		else {
		    xmlAddChild(parent, tmp);
		    last = tmp;
		}
	    }
	}
	/*
	 * Skip to next node in document order
	 */
	if ((list == NULL) || ((last == NULL) && (parent == NULL)))  {
	    STRANGE
	    return(NULL);
	}
	cur = xmlXPtrAdvanceNode(cur, NULL);
    }
    return(list);
}